

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::ParallelFunctionAnalysis::Mapper::create(Mapper *this)

{
  Module *module;
  Map *map;
  void *this_00;
  long in_RSI;
  _Any_data local_50;
  _Manager_type local_40;
  
  module = *(Module **)(in_RSI + 0x108);
  map = *(Map **)(in_RSI + 0x110);
  this_00 = operator_new(0x138);
  std::function<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&)>::
  function((function<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&)>
            *)&local_50,
           (function<void_(wasm::Function_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_&)>
            *)(in_RSI + 0x118));
  ParallelFunctionAnalysis<std::vector<wasm::Name,std::allocator<wasm::Name>>,(wasm::
  Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::
  function<void(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)>)::Mapper::
  Mapper(wasm::Module&,std::map<wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::
  Name>>,std::less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,std::vector<wasm::
  Name,std::allocator<wasm::Name>>>>>&,std::function<void(wasm::Function*,std::vector<wasm::Name,std
  ::allocator<wasm::Name>_>__>_(this_00,module,map,(Func *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  *(void **)this = this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }